

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O2

void __thiscall
MethodProperty_MoveProp_Test::~MethodProperty_MoveProp_Test(MethodProperty_MoveProp_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, MoveProp)
{
  MethodMovableType obj;
  auto remembered_value = obj.m_value1.getId();
  obj.value2 = std::move( obj.value1 );
  EXPECT_NE( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( remembered_value, obj.m_value1.getId() );
  
  remembered_value = obj.m_value3.id;
  obj.value2 = std::move( obj.value3 );
  EXPECT_EQ( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( remembered_value, obj.m_value3.id );
  
  remembered_value = obj.m_ro_value.getId();
  obj.value2 = std::move( obj.ro_value );
  EXPECT_NE( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( remembered_value, obj.m_ro_value.getId() );
  
  remembered_value = obj.m_ro_value2.id;
  obj.value2 = std::move( obj.ro_value2 );
  EXPECT_EQ( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( remembered_value, obj.m_ro_value2.id );
}